

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LineLimitTests.cpp
# Opt level: O2

void __thiscall
agge::tests::LimitEllipsisTests::TrimPositionIsResetOnNewLine(LimitEllipsisTests *this)

{
  bool value;
  allocator local_d9;
  char *local_d8;
  string local_d0;
  char *i;
  LocationInfo local_a8;
  layout_builder b;
  ellipsis e;
  
  b.ellipsis_codepoint = 0x2026;
  b.ellipsis_symbol.first = 0x8b;
  b.ellipsis_symbol.second = 3.71;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b.state.extent = 0.0;
  b.state.next = 0;
  i = "foobar";
  e._limit = 50.0;
  e._symbol_codepoint = 0x2026;
  e._at.extent = 0.0;
  e._at.next = 0;
  b.trimmed_at.
  super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  b.appended.
  super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  e._symbol.first = 0;
  e._symbol.second = 0.0;
  e._at_symbol.first = 0;
  e._at_symbol.second = 0.0;
  e._stop = false;
  limit::ellipsis::begin_style<agge::tests::mocks::layout_builder>(&e,&b);
  b.state.extent = 46.0;
  b.state.next = 10;
  limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
            (&e,&b,0x19,5.0,&i,"oobar","");
  if (b.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      b.appended.
      super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    b.appended.
    super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         b.appended.
         super__Vector_base<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>,_std::allocator<std::pair<unsigned_long,_std::pair<unsigned_int,_float>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  if (b.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      b.trimmed_at.
      super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    b.trimmed_at.
    super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>.
    _M_impl.super__Vector_impl_data._M_finish =
         b.trimmed_at.
         super__Vector_base<agge::layout_builder::state,_std::allocator<agge::layout_builder::state>_>
         ._M_impl.super__Vector_impl_data._M_start;
  }
  e._at.extent = 0.0;
  e._at.next = 0;
  e._stop = false;
  b.state.extent = 46.3;
  value = limit::ellipsis::add_glyph<agge::tests::mocks::layout_builder,char_const*>
                    (&e,&b,0x19,4.1,&i,"bar","");
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,(allocator *)&local_d8);
  ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0x181);
  ut::is_false(value,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,(allocator *)&local_d8);
  ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0x184);
  ut::
  is_empty<std::vector<std::pair<unsigned_long,std::pair<unsigned_int,float>>,std::allocator<std::pair<unsigned_long,std::pair<unsigned_int,float>>>>>
            (&b.appended,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,(allocator *)&local_d8);
  ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0x185);
  ut::is_empty<std::vector<agge::layout_builder::state,std::allocator<agge::layout_builder::state>>>
            (&b.trimmed_at,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d0);
  local_d8 = "oobar";
  std::__cxx11::string::string
            ((string *)&local_d0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LineLimitTests.cpp"
             ,&local_d9);
  ut::LocationInfo::LocationInfo(&local_a8,&local_d0,0x186);
  ut::are_equal<char_const*,char_const*>(&local_d8,&i,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_d0);
  mocks::layout_builder::~layout_builder(&b);
  return;
}

Assistant:

test( TrimPositionIsResetOnNewLine )
			{
				// INIT
				mocks::layout_builder b;
				const char *const begin = "foobar", *const end = begin + 6;
				const char *i = begin;
				limit::ellipsis e(50.0f);

				e.begin_style(b);
				b.state.extent = 50.0f - 4.0f;
				b.state.next = 10;

				e.add_glyph(b, 25, 5.0f, i, begin + 1, end);
				b.appended.clear();
				b.trimmed_at.clear();

				// ACT
				e.new_line();
				b.state.extent = 50.0f - 3.7f; // not enough space for the ellipsis
				assert_is_false(e.add_glyph(b, 25, 4.1f, i, begin + 3, end));

				// ASSERT
				assert_is_empty(b.appended);
				assert_is_empty(b.trimmed_at);
				assert_equal(begin + 1, i);
			}